

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O3

void __thiscall klogic::mlmvn::get_stats(mlmvn *this,size_t *n_weights,size_t *n_neurons)

{
  pointer pvVar1;
  pointer *ppmVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  
  *n_weights = 0;
  *n_neurons = 0;
  pvVar1 = (this->neurons).
           super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->neurons).
                super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 3) * -0x5555555555555555;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    ppmVar2 = (pointer *)
              ((long)&(pvVar1->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>).
                      _M_impl + 8);
    sVar3 = this->input_size;
    do {
      sVar5 = (long)*ppmVar2 - (long)((_Vector_impl_data *)(ppmVar2 + -1))->_M_start >> 5;
      *n_weights = *n_weights + (sVar3 + 1) * sVar5;
      *n_neurons = *n_neurons + sVar5;
      ppmVar2 = ppmVar2 + 3;
      lVar4 = lVar4 + -1;
      sVar3 = sVar5;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void klogic::mlmvn::get_stats(size_t &n_weights, size_t &n_neurons) const
{
    n_weights = 0, n_neurons = 0;

    size_t prev_layer_size = input_size;

    for (int layer = 0; layer < layers_count(); ++layer) {
        size_t layer_size = neurons[layer].size();

        n_weights += layer_size * (prev_layer_size + 1);
        n_neurons += layer_size;

        prev_layer_size = layer_size;
    }
}